

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_exchange_declare.c
# Opt level: O0

int main(int argc,char **argv)

{
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  undefined8 uVar1;
  long in_RSI;
  int in_EDI;
  amqp_connection_state_t conn;
  amqp_socket_t *socket;
  char *exchangetype;
  char *exchange;
  int status;
  int port;
  char *hostname;
  undefined8 in_stack_fffffffffffffec8;
  uint uVar2;
  int x_04;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 local_c0 [32];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  ulong local_80;
  ulong local_78;
  ulong in_stack_ffffffffffffff90;
  ulong local_68;
  undefined1 local_60 [32];
  undefined8 local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  int local_1c;
  undefined8 local_18;
  long local_10;
  int local_4;
  
  uVar2 = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_4 = 0;
  local_38 = 0;
  if (in_EDI < 5) {
    fprintf(_stderr,"Usage: amqp_exchange_declare host port exchange exchangetype\n");
    local_4 = 1;
  }
  else {
    local_18 = *(undefined8 *)(in_RSI + 8);
    local_10 = in_RSI;
    local_1c = atoi(*(char **)(in_RSI + 0x10));
    local_28 = *(undefined8 *)(local_10 + 0x18);
    local_30 = *(undefined8 *)(local_10 + 0x20);
    local_40 = amqp_new_connection();
    local_38 = amqp_tcp_socket_new(local_40);
    if (local_38 == 0) {
      die("creating TCP socket");
    }
    local_20 = amqp_socket_open(local_38,local_18,local_1c);
    if (local_20 != 0) {
      die("opening TCP socket");
    }
    amqp_login(local_60,local_40,"/",0,0x20000,0,(ulong)uVar2 << 0x20,"guest","guest");
    x.reply._0_8_ = in_stack_ffffffffffffff18;
    x._0_8_ = in_stack_ffffffffffffff10;
    x.reply.decoded = (void *)in_stack_ffffffffffffff20;
    x._24_8_ = in_stack_ffffffffffffff28;
    die_on_amqp_error(x,in_stack_ffffffffffffff00);
    amqp_channel_open(local_40,1);
    amqp_get_rpc_reply(&local_80,local_40);
    x_00.reply._0_8_ = in_stack_ffffffffffffff18;
    x_00._0_8_ = in_stack_ffffffffffffff10;
    x_00.reply.decoded = (void *)in_stack_ffffffffffffff20;
    x_00._24_8_ = in_stack_ffffffffffffff28;
    die_on_amqp_error(x_00,in_stack_ffffffffffffff00);
    uVar1 = local_40;
    local_90 = amqp_cstring_bytes(local_28);
    local_a0 = amqp_cstring_bytes(local_30);
    amqp_exchange_declare
              (uVar1,1,local_90._0_8_,local_90._8_8_,local_a0._0_8_,local_a0._8_8_,
               local_80 & 0xffffffff00000000,local_78 & 0xffffffff00000000,
               in_stack_ffffffffffffff90 & 0xffffffff00000000,local_68 & 0xffffffff00000000,
               _amqp_empty_table,_usleep);
    amqp_get_rpc_reply(local_c0,local_40);
    x_01.reply._0_8_ = in_stack_ffffffffffffff18;
    x_01._0_8_ = in_stack_ffffffffffffff10;
    x_01.reply.decoded = (void *)in_stack_ffffffffffffff20;
    x_01._24_8_ = in_stack_ffffffffffffff28;
    die_on_amqp_error(x_01,in_stack_ffffffffffffff00);
    amqp_channel_close(&stack0xffffffffffffff20,local_40,1,200);
    x_02.reply._0_8_ = in_stack_ffffffffffffff18;
    x_02._0_8_ = in_stack_ffffffffffffff10;
    x_02.reply.decoded = (void *)in_stack_ffffffffffffff20;
    x_02._24_8_ = in_stack_ffffffffffffff28;
    die_on_amqp_error(x_02,in_stack_ffffffffffffff00);
    amqp_connection_close(&stack0xffffffffffffff00,local_40,200);
    x_03.reply._0_8_ = in_stack_ffffffffffffff18;
    x_03._0_8_ = in_stack_ffffffffffffff10;
    x_03.reply.decoded = (void *)in_stack_ffffffffffffff20;
    x_03._24_8_ = in_stack_ffffffffffffff28;
    die_on_amqp_error(x_03,in_stack_ffffffffffffff00);
    x_04 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    amqp_destroy_connection(local_40);
    die_on_error(x_04,in_stack_ffffffffffffff10);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char const *const *argv)
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *exchangetype;
  amqp_socket_t *socket = NULL;
  amqp_connection_state_t conn;

  if (argc < 5) {
    fprintf(stderr, "Usage: amqp_exchange_declare host port exchange exchangetype\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  exchangetype = argv[4];

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);
  if (!socket) {
    die("creating TCP socket");
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening TCP socket");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  amqp_exchange_declare(conn, 1, amqp_cstring_bytes(exchange), amqp_cstring_bytes(exchangetype),
                        0, 0, 0, 0, amqp_empty_table);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Declaring exchange");

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");
  return 0;
}